

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O1

int absl::lts_20250127::base_internal::LLA_SkiplistLevels(size_t size,size_t base,uint32_t *random)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long extraout_RDX;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar3 = size - 0x28;
  iVar6 = 0;
  if (base < size) {
    iVar6 = 0;
    do {
      iVar6 = iVar6 + 1;
      size = size >> 1;
    } while (base < size);
  }
  uVar3 = uVar3 >> 3;
  if (random == (uint32_t *)0x0) {
    iVar7 = 1;
  }
  else {
    size = (size_t)*random;
    iVar7 = 0;
    do {
      uVar9 = (int)size * 0x41c64e6d + 0x3039;
      size = (size_t)uVar9;
      iVar7 = iVar7 + 1;
    } while ((uVar9 >> 0x1e & 1) == 0);
    *random = uVar9;
  }
  uVar9 = iVar7 + iVar6;
  uVar8 = (ulong)uVar9;
  if (uVar3 < (ulong)(long)(int)uVar9) {
    uVar9 = (uint)uVar3;
  }
  if (0 < (int)uVar9) {
    uVar2 = 0x1d;
    if ((int)uVar9 < 0x1d) {
      uVar2 = uVar9;
    }
    return uVar2;
  }
  LLA_SkiplistLevels();
  lVar4 = (long)*(int *)(size + 0x20);
  uVar3 = size;
  if (0 < lVar4) {
    do {
      lVar5 = lVar4 + -1;
      do {
        uVar10 = uVar3;
        uVar3 = *(ulong *)(uVar10 + 0x28 + lVar5 * 8);
        if (uVar3 == 0) break;
      } while (uVar3 < uVar8);
      *(ulong *)(extraout_RDX + lVar5 * 8) = uVar10;
      bVar1 = 1 < lVar4;
      lVar4 = lVar5;
      uVar3 = uVar10;
    } while (bVar1);
  }
  iVar6 = *(int *)(size + 0x20);
  lVar4 = (long)iVar6;
  uVar9 = *(uint *)(uVar8 + 0x20);
  if (iVar6 < (int)uVar9) {
    do {
      iVar6 = iVar6 + 1;
      *(size_t *)(extraout_RDX + lVar4 * 8) = size;
      lVar4 = lVar4 + 1;
      *(int *)(size + 0x20) = iVar6;
      uVar9 = *(uint *)(uVar8 + 0x20);
    } while (lVar4 < (int)uVar9);
  }
  uVar2 = (uint)lVar4;
  if (uVar9 != 0) {
    uVar3 = 0;
    do {
      *(undefined8 *)(uVar8 + 0x28 + uVar3 * 8) =
           *(undefined8 *)(*(long *)(extraout_RDX + uVar3 * 8) + 0x28 + uVar3 * 8);
      *(ulong *)(*(long *)(extraout_RDX + uVar3 * 8) + 0x28 + uVar3 * 8) = uVar8;
      uVar3 = uVar3 + 1;
      uVar2 = uVar9;
    } while (uVar9 != uVar3);
  }
  return uVar2;
}

Assistant:

static int LLA_SkiplistLevels(size_t size, size_t base, uint32_t *random) {
  // max_fit is the maximum number of levels that will fit in a node for the
  // given size.   We can't return more than max_fit, no matter what the
  // random number generator says.
  size_t max_fit = (size - offsetof(AllocList, next)) / sizeof(AllocList *);
  int level = IntLog2(size, base) + (random != nullptr ? Random(random) : 1);
  if (static_cast<size_t>(level) > max_fit) level = static_cast<int>(max_fit);
  if (level > kMaxLevel - 1) level = kMaxLevel - 1;
  ABSL_RAW_CHECK(level >= 1, "block not big enough for even one level");
  return level;
}